

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O1

void __thiscall D2xNvmFlash::writeOptions(D2xNvmFlash *this)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  _Head_base<0UL,_unsigned_char_*,_false> _Var5;
  bool bVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  _Bit_type *p_Var10;
  uint uVar11;
  pointer *__ptr;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __last1;
  _Bit_iterator __first2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> userRow;
  vector<bool,_std::allocator<bool>_> current;
  _Head_base<0UL,_unsigned_char_*,_false> local_58;
  void *local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  long local_30;
  
  local_58._M_head_impl = (uchar *)0x0;
  iVar7 = (*(this->super_Flash)._vptr_Flash[0x13])();
  if (((char)iVar7 != '\0') && ((this->super_Flash)._bor._dirty == true)) {
    bVar6 = (this->super_Flash)._bor._value;
    iVar7 = (*(this->super_Flash)._vptr_Flash[0x11])(this);
    if (bVar6 != (bool)(char)iVar7) {
      readUserRow(this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_58);
      bVar12 = 7;
      if ((this->super_Flash)._bor._value == false) {
        bVar12 = 0;
      }
      local_58._M_head_impl[1] = bVar12 | local_58._M_head_impl[1] & 0xf8;
    }
  }
  iVar7 = (*(this->super_Flash)._vptr_Flash[0x10])(this);
  if (((char)iVar7 != '\0') && ((this->super_Flash)._bod._dirty == true)) {
    bVar6 = (this->super_Flash)._bod._value;
    iVar7 = (*(this->super_Flash)._vptr_Flash[0xe])(this);
    if (bVar6 != (bool)(char)iVar7) {
      readUserRow(this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_58);
      bVar12 = 6;
      if ((this->super_Flash)._bod._value == false) {
        bVar12 = 0;
      }
      local_58._M_head_impl[1] = bVar12 | local_58._M_head_impl[1] & 0xf9;
    }
  }
  if ((this->super_Flash)._regions._dirty == true) {
    (*(this->super_Flash)._vptr_Flash[10])(&local_50);
    p_Var4 = &(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl
    ;
    uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last1.super__Bit_iterator_base._M_offset = uVar3;
    __last1.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_50;
    bVar6 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_iterator>
                      (__first1,__last1,__first2);
    if (!bVar6) {
      readUserRow(this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_58);
      p_Var10 = (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if (((long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)p_Var10) * 8 +
          (ulong)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                 _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0)
      {
        uVar11 = 1;
        uVar13 = 0;
        do {
          uVar14 = uVar11 - 1 >> 3;
          bVar15 = (byte)(1 << ((byte)(uVar11 - 1) & 7));
          bVar12 = ~bVar15 & (local_58._M_head_impl + 6)[uVar14];
          if ((p_Var10[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
            bVar12 = (local_58._M_head_impl + 6)[uVar14] | bVar15;
          }
          (local_58._M_head_impl + 6)[uVar14] = bVar12;
          uVar13 = (ulong)uVar11;
          p_Var10 = (this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar11 = uVar11 + 1;
        } while (uVar13 < (ulong)(this->super_Flash)._regions._value.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                 _M_offset +
                          ((long)(this->super_Flash)._regions._value.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                          (long)p_Var10) * 8);
      }
    }
    if (local_50 != (void *)0x0) {
      operator_delete(local_50,local_30 - (long)local_50);
      local_50 = (void *)0x0;
      local_48 = 0;
      local_40 = 0;
      local_38 = 0;
      local_30 = 0;
    }
  }
  _Var5._M_head_impl = local_58._M_head_impl;
  if (local_58._M_head_impl != (uchar *)0x0) {
    uVar8 = Samba::readWord((this->super_Flash)._samba,0x41004004);
    Samba::writeWord((this->super_Flash)._samba,0x41004004,uVar8 | 0x40080);
    Samba::writeWord((this->super_Flash)._samba,0x4100401c,0x402000);
    command(this,'\x05');
    uVar11 = (this->super_Flash)._size;
    if ((uVar11 & 0x3fffffff) != 0) {
      this_00 = &(this->super_Flash)._wordCopy;
      uVar13 = 0;
      do {
        (*(this->super_Flash)._vptr_Flash[0x1b])
                  (this,_Var5._M_head_impl + uVar13,(ulong)(uVar11 & 0xffff));
        command(this,'D');
        uVar8 = (int)uVar13 + 0x804000;
        WordCopyApplet::setDstAddr(this_00,uVar8);
        WordCopyApplet::setSrcAddr
                  (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
        pbVar1 = &(this->super_Flash)._onBufferA;
        *pbVar1 = (bool)(*pbVar1 ^ 1);
        do {
          uVar9 = Samba::readWord((this->super_Flash)._samba,0x41004014);
        } while ((uVar9 & 1) == 0);
        Applet::runv(&this_00->super_Applet);
        Samba::writeWord((this->super_Flash)._samba,0x4100401c,uVar8 >> 1);
        command(this,'\x06');
        uVar11 = (this->super_Flash)._size;
        uVar14 = (int)uVar13 + uVar11;
        uVar13 = (ulong)uVar14;
      } while (uVar14 < uVar11 * 4);
    }
  }
  if (((this->super_Flash)._security._dirty == true) &&
     ((this->super_Flash)._security._value == true)) {
    iVar7 = (*(this->super_Flash)._vptr_Flash[0xc])(this);
    if ((char)iVar7 != '\x01') {
      command(this,'E');
    }
  }
  if (_Var5._M_head_impl != (uchar *)0x0) {
    operator_delete__(_Var5._M_head_impl);
  }
  return;
}

Assistant:

void
D2xNvmFlash::writeOptions()
{
    std::unique_ptr<uint8_t[]> userRow;

    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        readUserRow(userRow);
        if (_bor.get())
            userRow[NVM_UR_BOD33_RESET_OFFSET] |= NVM_UR_BOD33_RESET_MASK;
        else
            userRow[NVM_UR_BOD33_RESET_OFFSET] &= ~NVM_UR_BOD33_RESET_MASK;
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        readUserRow(userRow);
        if (_bod.get())
            userRow[NVM_UR_BOD33_ENABLE_OFFSET] |= NVM_UR_BOD33_ENABLE_MASK;
        else
            userRow[NVM_UR_BOD33_ENABLE_OFFSET] &= ~NVM_UR_BOD33_ENABLE_MASK;
    }
    if (_regions.isDirty())
    {
        // Check if any lock bits are different from the current set
        std::vector<bool> current = getLockRegions();
        if (!equal(_regions.get().begin(), _regions.get().end(), current.begin()))
        {
            readUserRow(userRow);

            uint8_t* lockBits = &userRow[NVM_UR_NVM_LOCK_OFFSET];
            for (uint32_t region = 0; region < _regions.get().size(); region++)
            {
                if (_regions.get()[region])
                    lockBits[region / 8] &= ~(1 << (region % 8));
                else
                    lockBits[region / 8] |= (1 << (region % 8));
            }
        }
    }

    // Erase and write the user row if modified
    if (userRow)
    {
        // Disable cache and configure manual page write
        writeReg(NVM_REG_CTRLB, readReg(NVM_REG_CTRLB) | (0x1 << 18) | (0x1 << 7));

        // Erase user row
        writeReg(NVM_REG_ADDR, NVM_UR_ADDR / 2);
        command(NVM_CMD_EAR);

        // Write user row in page chunks
        for (uint32_t offset = 0; offset < NVM_UR_SIZE; offset += _size)
        {
            // Load the buffer with the page
            loadBuffer(&userRow[offset], _size);

            // Clear page buffer
            command(NVM_CMD_PBC);

            // Copy page to page buffer
            _wordCopy.setDstAddr(NVM_UR_ADDR + offset);
            _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
            _onBufferA = !_onBufferA;
            waitReady();
            _wordCopy.runv();

            // Write the page
            writeReg(NVM_REG_ADDR, (NVM_UR_ADDR + offset) / 2);
            command(NVM_CMD_WAP);
        }
    }

    // Always do security last
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        command(NVM_CMD_SSB);
    }
}